

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall ParserProbModelXML::ReadObservations(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  Index IVar2;
  xmlXPathObjectPtr pxVar3;
  ulong uVar4;
  xmlXPathObjectPtr pxVar5;
  ostream *poVar6;
  char *pcVar7;
  xmlNodePtr node;
  xmlXPathObjectPtr pxVar8;
  mapped_type *pmVar9;
  EParse *this_00;
  int j;
  ParserProbModelXML *pPVar10;
  _Alloc_hider this_01;
  ParserProbModelXML *this_02;
  long lVar11;
  vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
  parsed_actions;
  string parent_name;
  string obs_name;
  string comment;
  undefined1 local_360 [32];
  stringstream obs_path_ss;
  ostream local_330 [376];
  string agent_name;
  
  pxVar3 = GetNodesMatchingExpression
                     (this,(xmlChar *)
                           "/ProbModelXML/ProbNet/Variables/Variable[@timeSlice=\'1\' and @role=\'decision\']"
                      ,(xmlNodePtr)0x0);
  if (pxVar3 == (xmlXPathObjectPtr)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "Warning: No action nodes for the second timeslice were found in the target file. There are no observations in the model."
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    return;
  }
  pxVar1 = pxVar3->nodesetval;
  lVar11 = 0;
  parsed_actions.
  super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsed_actions.
  super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed_actions.
  super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if (pxVar1->nodeNr <= lVar11) {
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_xmlNode*>*,std::vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_int,_xmlNode*>,std::pair<unsigned_int,_xmlNode*>)>>
                ((__normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
                  )parsed_actions.
                   super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
                  )parsed_actions.
                   super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(std::pair<unsigned_int,__xmlNode_*>,_std::pair<unsigned_int,__xmlNode_*>)>
                  )0x49da51);
      uVar4 = 0;
      while( true ) {
        if ((ulong)((long)parsed_actions.
                          super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)parsed_actions.
                          super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
        pPVar10 = (ParserProbModelXML *)0x0;
        if (this->_m_asynchronousModel == false) {
          pPVar10 = (ParserProbModelXML *)
                    (ulong)parsed_actions.
                           super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].first;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&agent_name);
        poVar6 = std::operator<<((ostream *)agent_name.field_2._M_local_buf,
                                 "/ProbModelXML/ProbNet/Links/Link/Variable[starts-with(@name, \"");
        pcVar7 = (char *)xmlGetProp(parsed_actions.
                                    super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar4].second,"name");
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::operator<<(poVar6,"\") and @timeSlice=\'1\']");
        std::__cxx11::stringbuf::str();
        pcVar7 = (char *)_obs_path_ss;
        pxVar5 = GetNodesMatchingExpression(this,(xmlChar *)_obs_path_ss,(xmlNodePtr)0x0);
        std::__cxx11::string::~string((string *)&obs_path_ss);
        if (pxVar5 != (xmlXPathObjectPtr)0x0) {
          pxVar1 = pxVar5->nodesetval;
          if (1 < pxVar1->nodeNr) {
            pcVar7 = "Warning: multiple obervation factors for one agent are not yet supported.";
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "Warning: multiple obervation factors for one agent are not yet supported."
                                    );
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          node = (xmlNodePtr)xmlFirstElementChild((*pxVar1->nodeTab)->parent);
          GetVariableName_abi_cxx11_(&parent_name,(ParserProbModelXML *)pcVar7,node);
          std::__cxx11::stringstream::stringstream((stringstream *)&obs_path_ss);
          poVar6 = std::operator<<(local_330,"/ProbModelXML/ProbNet/Variables/Variable[(@name=\'");
          poVar6 = std::operator<<(poVar6,(string *)&parent_name);
          poVar6 = std::operator<<(poVar6,"\' or @name=\'");
          poVar6 = std::operator<<(poVar6,(string *)&parent_name);
          std::operator<<(poVar6," [1]\') and @timeSlice=\'1\' and @role=\'chance\']");
          GetVariableComment_abi_cxx11_(&comment,this,node);
          std::operator<<(local_330,"/States/State");
          std::__cxx11::stringbuf::str();
          this_01 = obs_name._M_dataplus;
          pxVar8 = GetNodesMatchingExpression
                             (this,(xmlChar *)obs_name._M_dataplus._M_p,(xmlNodePtr)0x0);
          std::__cxx11::string::~string((string *)&obs_name);
          if (pxVar8 != (xmlXPathObjectPtr)0x0) {
            pxVar1 = pxVar8->nodesetval;
            for (lVar11 = 0; lVar11 < pxVar1->nodeNr; lVar11 = lVar11 + 1) {
              GetVariableName_abi_cxx11_
                        (&obs_name,(ParserProbModelXML *)this_01._M_p,pxVar1->nodeTab[lVar11]);
              this_02 = pPVar10;
              MADPComponentDiscreteObservations::AddObservation
                        (&(this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates
                          )._m_O,(Index)pPVar10,&obs_name,&comment);
              GetVariableName_abi_cxx11_((string *)local_360,this_02,node);
              this_01._M_p = (pointer)local_360;
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
                       ::operator[](&this->_m_parsedElements,(key_type *)local_360);
              pmVar9->first = OBSERVATION;
              pmVar9->second = (Index)pPVar10;
              std::__cxx11::string::~string((string *)local_360);
              std::__cxx11::string::~string((string *)&obs_name);
            }
            xmlXPathFreeObject(pxVar8);
          }
          xmlXPathFreeObject(pxVar5);
          std::__cxx11::string::~string((string *)&comment);
          std::__cxx11::stringstream::~stringstream((stringstream *)&obs_path_ss);
          std::__cxx11::string::~string((string *)&parent_name);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&agent_name);
        uVar4 = uVar4 + 1;
      }
      xmlXPathFreeObject(pxVar3);
      MADPComponentDiscreteObservations::SetInitialized
                (&(this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_O,
                 true);
      std::
      _Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
      ::~_Vector_base(&parsed_actions.
                       super__Vector_base<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                     );
      return;
    }
    if (this->_m_agentsInitialized == false) {
LAB_0049d5d1:
      IVar2 = (Index)lVar11;
    }
    else {
      uVar4 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0x10))();
      if (uVar4 < 2) goto LAB_0049d5d1;
      pPVar10 = (ParserProbModelXML *)0x52c64b;
      pxVar5 = GetNodesMatchingExpression(this,"Agent",pxVar1->nodeTab[lVar11]);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        this_00 = (EParse *)__cxa_allocate_exception(0x28);
        EParse::EParse(this_00,"Found an action node with no associated agent.");
        __cxa_throw(this_00,&EParse::typeinfo,E::~E);
      }
      GetVariableName_abi_cxx11_(&agent_name,pPVar10,*pxVar5->nodesetval->nodeTab);
      IVar2 = MultiAgentDecisionProcess::GetAgentIndexByName
                        ((MultiAgentDecisionProcess *)this->_m_fDecPOMDP,&agent_name);
      xmlXPathFreeObject(pxVar5);
      std::__cxx11::string::~string((string *)&agent_name);
    }
    agent_name._M_string_length = (size_type)pxVar1->nodeTab[lVar11];
    agent_name._M_dataplus._M_p._0_4_ = IVar2;
    std::vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>
    ::emplace_back<std::pair<unsigned_int,_xmlNode*>>
              ((vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>
                *)&parsed_actions,(pair<unsigned_int,__xmlNode_*> *)&agent_name);
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void ParserProbModelXML::ReadObservations()
{
    if(DEBUG_PARSE)
    {
        cout << " --- Now Parsing Observations ---" << endl;
    }
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Variables/Variable[@timeSlice='1' and @role='decision']";
    xmlXPathObjectPtr action_nodes = GetNodesMatchingExpression(xpath);

    if (action_nodes == NULL){
        cout  << "Warning: No action nodes for the second timeslice were found in the target file. There are no observations in the model." << endl;
        return;
    }

    xmlNodeSetPtr action_nodeset = action_nodes->nodesetval;
    vector<pair<Index, xmlNodePtr> > parsed_actions;
    for (int i = 0; i < action_nodeset->nodeNr; i++)
    {
        Index aI;
        if(_m_agentsInitialized && _m_fDecPOMDP->GetNrAgents() > 1)
        {
            xmlXPathObjectPtr agent_node = GetNodesMatchingExpression((xmlChar*) "Agent",action_nodeset->nodeTab[i]);
            if(agent_node == NULL)
                throw EParse("Found an action node with no associated agent.");
            
            string agent_name = GetVariableName(agent_node->nodesetval->nodeTab[0]);
            aI = _m_fDecPOMDP->GetAgentIndexByName(agent_name);
            xmlXPathFreeObject (agent_node);
        }
        else
        {
            aI = i;
        }
        parsed_actions.push_back(make_pair(aI, action_nodeset->nodeTab[i]));
    }

    //Observations have to be loaded in agent-wise order
    sort(parsed_actions.begin(), parsed_actions.end(), CompareParsedActions);

    for (size_t i = 0; i < parsed_actions.size(); i++)
    {
        Index aI;
        if(_m_asynchronousModel)
            aI = 0; //asynchronous models are assumed to be centralized, for now.
        else
            aI = parsed_actions[i].first;
        //retrieving the nodes which link to each decision node for T+1
        stringstream link_path_ss;
        link_path_ss << "/ProbModelXML/ProbNet/Links/Link/Variable[starts-with(@name, \""
                     << (char*) xmlGetProp(parsed_actions[i].second, (xmlChar*) "name")
                     << "\") and @timeSlice='1']";
        xmlXPathObjectPtr link_nodes = GetNodesMatchingExpression((xmlChar*) link_path_ss.str().c_str());

        if(link_nodes != NULL)
        {
            xmlNodeSetPtr link_nodeset = link_nodes->nodesetval;
            if(link_nodeset->nodeNr > 1){
                cout << "Warning: multiple obervation factors for one agent are not yet supported." << endl;
            }
            //For now, it is assumed that the observation model is factored agent-wise - that is, there is no more than one 
            //chance node linked to each decision node in slice T+1. If support for this feature is needed, it should be added here.
            //Each link_nodeset->nodeTab element should represent one of the observation factors of agent i.
            xmlNodePtr parent_node = xmlFirstElementChild(link_nodeset->nodeTab[0]->parent);
            string parent_name =  GetVariableName(parent_node);
            //now we must retrieve the original chance nodes with this name and parse them.
            stringstream obs_path_ss;
            obs_path_ss << "/ProbModelXML/ProbNet/Variables/Variable[(@name='"
                        << parent_name << "' or @name='" << parent_name << " [1]') and @timeSlice='1' and @role='chance']";
            string comment = GetVariableComment(parent_node);
            obs_path_ss << "/States/State";
            xmlXPathObjectPtr obs_nodes = GetNodesMatchingExpression((xmlChar*) obs_path_ss.str().c_str());
            if(obs_nodes != NULL)
            {        
                xmlNodeSetPtr obs_nodeset = obs_nodes->nodesetval;
                for(int j = 0; j < obs_nodeset->nodeNr; j++)
                {
                    string obs_name = GetVariableName(obs_nodeset->nodeTab[j]);
                    _m_fDecPOMDP->AddObservation(aI, obs_name, comment);
                    pair<elm_type, Index> element = make_pair(OBSERVATION, aI);
                    _m_parsedElements[GetVariableName(parent_node)] = element;
                    if(DEBUG_PARSE)
                    {
                        cout << "Added observation: " << obs_name << " to agent " << aI << endl;
                    }
                }
                xmlXPathFreeObject (obs_nodes);
            }
            xmlXPathFreeObject (link_nodes);
        }
    }
    xmlXPathFreeObject (action_nodes);

    _m_fDecPOMDP->SetObservationsInitialized(true);

    return;
}